

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::cancel(BuildSystemFrontendDelegate *this)

{
  long lVar1;
  
  lVar1 = *(long *)((long)this->impl + 0x30);
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(lVar1 + 0x28))->__data);
  *(undefined1 *)(lVar1 + 0x50) = 1;
  if (*(BuildSystem **)(lVar1 + 0x20) != (BuildSystem *)0x0) {
    BuildSystem::cancel(*(BuildSystem **)(lVar1 + 0x20));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0x28));
  return;
}

Assistant:

void BuildSystemFrontendDelegate::cancel() {
  auto delegateImpl = static_cast<BuildSystemFrontendDelegateImpl*>(impl);
  delegateImpl->frontend->cancel();
}